

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O2

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
viface::VIfaceImpl::listStats_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,VIfaceImpl *this)

{
  _Rb_tree_header *p_Var1;
  string *__rhs;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  runtime_error *prVar7;
  allocator local_1e9;
  string entry;
  string path;
  ostringstream what;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&what);
  __rhs = &this->name;
  std::operator+(&entry,"/sys/class/net/",__rhs);
  std::operator+(&path,&entry,"/statistics/");
  std::__cxx11::string::~string((string *)&entry);
  __dirp = opendir(path._M_dataplus._M_p);
  if (__dirp == (DIR *)0x0) {
    std::operator<<((ostream *)&what,"--- Unable to open statistics folder for interface ");
    poVar4 = std::operator<<((ostream *)&what,(string *)__rhs);
    poVar4 = std::operator<<(poVar4,":");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&what,"    ");
    poVar4 = std::operator<<(poVar4,(string *)&path);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&what,"    Error: ");
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    std::operator<<(poVar4,pcVar6);
    poVar4 = std::operator<<((ostream *)&what," (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar5);
    poVar4 = std::operator<<(poVar4,").");
    std::endl<char,std::char_traits<char>>(poVar4);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)&entry);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  while( true ) {
    pdVar3 = readdir(__dirp);
    if (pdVar3 == (dirent *)0x0) break;
    std::__cxx11::string::string((string *)&entry,pdVar3->d_name,&local_1e9);
    if (*entry._M_dataplus._M_p != '.') {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,&entry);
    }
    std::__cxx11::string::~string((string *)&entry);
  }
  iVar2 = closedir(__dirp);
  if (iVar2 == 0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(this->stats_keys_cache)._M_t,&__return_storage_ptr__->_M_t);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&what);
    return __return_storage_ptr__;
  }
  std::operator<<((ostream *)&what,"--- Unable to close statistics folder for interface ");
  poVar4 = std::operator<<((ostream *)&what,(string *)__rhs);
  poVar4 = std::operator<<(poVar4,":");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&what,"    ");
  poVar4 = std::operator<<(poVar4,(string *)&path);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&what,"    Error: ");
  piVar5 = __errno_location();
  pcVar6 = strerror(*piVar5);
  std::operator<<(poVar4,pcVar6);
  poVar4 = std::operator<<((ostream *)&what," (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar5);
  poVar4 = std::operator<<(poVar4,").");
  std::endl<char,std::char_traits<char>>(poVar4);
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar7,(string *)&entry);
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::set<std::string> VIfaceImpl::listStats()
{
    set<string> result;

    DIR* dir;
    struct dirent* ent;
    ostringstream what;
    string path = "/sys/class/net/" + this->name + "/statistics/";

    // Open directory
    if ((dir = opendir(path.c_str())) == NULL) {
        what << "--- Unable to open statistics folder for interface ";
        what << this->name << ":" << endl;
        what << "    " << path << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    // List files
    while ((ent = readdir(dir)) != NULL) {
        string entry(ent->d_name);

        // Ignore current, parent and hidden files
        if (entry[0] != '.') {
            result.insert(entry);
        }
    }

    // Close directory
    if (closedir(dir) != 0) {
        what << "--- Unable to close statistics folder for interface ";
        what << this->name << ":" << endl;
        what << "    " << path << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    // Update cache
    this->stats_keys_cache = result;

    return result;
}